

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
          (AsyncQueue<nrg::InstantExecution> *this,function<void_()> *param)

{
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  std::mutex::lock(&this->guard_);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = param->_M_invoker;
  p_Var1 = (param->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(param->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(param->super__Function_base)._M_functor + 8);
    (param->super__Function_base)._M_manager = (_Manager_type)0x0;
    param->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,
             (function<void_()> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }